

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_batch_insert.cpp
# Opt level: O2

void __thiscall
duckdb::MergeCollectionTask::Execute
          (MergeCollectionTask *this,PhysicalBatchInsert *op,ClientContext *context,
          GlobalSinkState *g_state_p,LocalSinkState *l_state_p)

{
  pointer *this_00;
  pthread_mutex_t *__mutex;
  pointer pRVar1;
  idx_t __p;
  DataTable *pDVar2;
  type writer;
  RowGroupCollection *this_01;
  __normal_iterator<duckdb::RowGroupBatchEntry_*,_std::vector<duckdb::RowGroupBatchEntry,_std::allocator<duckdb::RowGroupBatchEntry>_>_>
  _Var3;
  InternalException *this_02;
  allocator local_79;
  RowGroupBatchEntry new_entry;
  string local_50;
  
  this_00 = &l_state_p[6].partition_info.partition_data.
             super_vector<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>
             .
             super__Vector_base<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (l_state_p[6].partition_info.partition_data.
      super_vector<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>.
      super__Vector_base<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>.
      _M_impl.super__Vector_impl_data._M_finish == (pointer)0x0) {
    pDVar2 = (DataTable *)
             (**(code **)(**(long **)&g_state_p[4].super_StateWithBlockableTasks.lock.
                                      super___mutex_base._M_mutex + 0x80))();
    make_uniq<duckdb::OptimisticDataWriter,duckdb::DataTable&>((duckdb *)&new_entry,pDVar2);
    __p = new_entry.batch_idx;
    new_entry.batch_idx = 0;
    ::std::
    __uniq_ptr_impl<duckdb::OptimisticDataWriter,_std::default_delete<duckdb::OptimisticDataWriter>_>
    ::reset((__uniq_ptr_impl<duckdb::OptimisticDataWriter,_std::default_delete<duckdb::OptimisticDataWriter>_>
             *)this_00,(pointer)__p);
    ::std::
    unique_ptr<duckdb::OptimisticDataWriter,_std::default_delete<duckdb::OptimisticDataWriter>_>::
    ~unique_ptr((unique_ptr<duckdb::OptimisticDataWriter,_std::default_delete<duckdb::OptimisticDataWriter>_>
                 *)&new_entry);
  }
  writer = unique_ptr<duckdb::OptimisticDataWriter,_std::default_delete<duckdb::OptimisticDataWriter>,_true>
           ::operator*((unique_ptr<duckdb::OptimisticDataWriter,_std::default_delete<duckdb::OptimisticDataWriter>,_true>
                        *)this_00);
  new_entry.collection_index =
       BatchInsertGlobalState::MergeCollections
                 ((BatchInsertGlobalState *)g_state_p,context,&this->merge_collections,writer);
  pRVar1 = (this->merge_collections).
           super_vector<duckdb::RowGroupBatchEntry,_std::allocator<duckdb::RowGroupBatchEntry>_>.
           super__Vector_base<duckdb::RowGroupBatchEntry,_std::allocator<duckdb::RowGroupBatchEntry>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->merge_collections).
      super_vector<duckdb::RowGroupBatchEntry,_std::allocator<duckdb::RowGroupBatchEntry>_>.
      super__Vector_base<duckdb::RowGroupBatchEntry,_std::allocator<duckdb::RowGroupBatchEntry>_>.
      _M_impl.super__Vector_impl_data._M_finish != pRVar1) {
    (this->merge_collections).
    super_vector<duckdb::RowGroupBatchEntry,_std::allocator<duckdb::RowGroupBatchEntry>_>.
    super__Vector_base<duckdb::RowGroupBatchEntry,_std::allocator<duckdb::RowGroupBatchEntry>_>.
    _M_impl.super__Vector_impl_data._M_finish = pRVar1;
  }
  __mutex = (pthread_mutex_t *)
            &g_state_p[3].super_StateWithBlockableTasks.blocked_tasks.
             super_vector<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
             super__Vector_base<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  ::std::mutex::lock((mutex *)&__mutex->__data);
  pDVar2 = (DataTable *)
           (**(code **)(**(long **)&g_state_p[4].super_StateWithBlockableTasks.lock.
                                    super___mutex_base._M_mutex + 0x80))();
  this_01 = DataTable::GetOptimisticCollection(pDVar2,context,new_entry.collection_index);
  new_entry.batch_idx = this->merged_batch_index;
  new_entry.total_rows = RowGroupCollection::GetTotalRows(this_01);
  new_entry.unflushed_memory = 0;
  new_entry.type = FLUSHED;
  _Var3 = ::std::
          __lower_bound<__gnu_cxx::__normal_iterator<duckdb::RowGroupBatchEntry*,std::vector<duckdb::RowGroupBatchEntry,std::allocator<duckdb::RowGroupBatchEntry>>>,duckdb::RowGroupBatchEntry,__gnu_cxx::__ops::_Iter_comp_val<duckdb::MergeCollectionTask::Execute(duckdb::PhysicalBatchInsert_const&,duckdb::ClientContext&,duckdb::GlobalSinkState&,duckdb::LocalSinkState&)::_lambda(duckdb::RowGroupBatchEntry_const&,duckdb::RowGroupBatchEntry_const&)_1_>>
                    (g_state_p[4].super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.
                     __data.__list.__prev,
                     g_state_p[4].super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.
                     __data.__list.__next);
  if ((_Var3._M_current)->batch_idx == this->merged_batch_index) {
    ((_Var3._M_current)->collection_index).index = new_entry.collection_index.index;
    pthread_mutex_unlock(__mutex);
    return;
  }
  this_02 = (InternalException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_50,"Merged batch index was no longer present in collection",&local_79)
  ;
  InternalException::InternalException(this_02,&local_50);
  __cxa_throw(this_02,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void Execute(const PhysicalBatchInsert &op, ClientContext &context, GlobalSinkState &g_state_p,
	             LocalSinkState &l_state_p) override {
		auto &g_state = g_state_p.Cast<BatchInsertGlobalState>();
		auto &l_state = l_state_p.Cast<BatchInsertLocalState>();

		// Merge the collections.
		if (!l_state.optimistic_writer) {
			l_state.optimistic_writer = make_uniq<OptimisticDataWriter>(g_state.table.GetStorage());
		}
		auto result_collection_index = g_state.MergeCollections(context, merge_collections, *l_state.optimistic_writer);
		merge_collections.clear();

		lock_guard<mutex> l(g_state.lock);
		auto &result_collection = g_state.table.GetStorage().GetOptimisticCollection(context, result_collection_index);
		RowGroupBatchEntry new_entry(result_collection, merged_batch_index, result_collection_index,
		                             RowGroupBatchType::FLUSHED);

		// Add the result collection to the set of batch indexes.
		auto it = std::lower_bound(
		    g_state.collections.begin(), g_state.collections.end(), new_entry,
		    [&](const RowGroupBatchEntry &a, const RowGroupBatchEntry &b) { return a.batch_idx < b.batch_idx; });
		if (it->batch_idx != merged_batch_index) {
			throw InternalException("Merged batch index was no longer present in collection");
		}
		it->collection_index = new_entry.collection_index;
	}